

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btok_sm.c
# Opt level: O2

void btokSMCtrInc(void *state)

{
  ulong uVar1;
  size_t pos;
  long lVar2;
  
  uVar1 = 1;
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    uVar1 = uVar1 + *(byte *)((long)state + lVar2 + 0x40);
    *(char *)((long)state + lVar2 + 0x40) = (char)uVar1;
    uVar1 = uVar1 >> 8;
  }
  return;
}

Assistant:

void btokSMCtrInc(void* state)
{
	btok_sm_st* st = (btok_sm_st*)state;
	register word carry = 1;
	size_t pos;
	// pre
	ASSERT(memIsValid(state, btokSM_keep()));
	// инкремент
	for (pos = 0; pos < 16; ++pos)
		carry += st->ctr[pos], st->ctr[pos] = (octet)carry, carry >>= 8;
	carry = 0;
}